

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

int32_t __thiscall
icu_63::PluralRules::getSamples
          (PluralRules *this,UnicodeString *keyword,double *dest,int32_t destCapacity,
          UErrorCode *status)

{
  int32_t iVar1;
  RuleChain *pRVar2;
  int32_t iVar3;
  
  iVar3 = 0;
  iVar1 = 0;
  if ((destCapacity != 0) && (iVar1 = iVar3, *status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (this->mInternalStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      pRVar2 = rulesForKeyword(this,keyword);
      if (pRVar2 != (RuleChain *)0x0) {
        iVar1 = getSamplesFromString(&pRVar2->fIntegerSamples,dest,destCapacity,status);
        if (iVar1 == 0) {
          iVar1 = getSamplesFromString(&pRVar2->fDecimalSamples,dest,destCapacity,status);
          return iVar1;
        }
      }
    }
    else {
      *status = this->mInternalStatus;
    }
  }
  return iVar1;
}

Assistant:

int32_t
PluralRules::getSamples(const UnicodeString &keyword, double *dest,
                        int32_t destCapacity, UErrorCode& status) {
    if (destCapacity == 0 || U_FAILURE(status)) {
        return 0;
    }
    if (U_FAILURE(mInternalStatus)) {
        status = mInternalStatus;
        return 0;
    }
    RuleChain *rc = rulesForKeyword(keyword);
    if (rc == nullptr) {
        return 0;
    }
    int32_t numSamples = getSamplesFromString(rc->fIntegerSamples, dest, destCapacity, status);
    if (numSamples == 0) {
        numSamples = getSamplesFromString(rc->fDecimalSamples, dest, destCapacity, status);
    }
    return numSamples;
}